

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase604::run(TestCase604 *this)

{
  long lVar1;
  NullableValue<kj::OwnFd> NVar2;
  SourceLocation location;
  int iVar3;
  __pid_t _Var4;
  void *pvVar5;
  ssize_t sVar6;
  PromiseBase PVar7;
  char c;
  OwnFd clientFd;
  OwnFd serverFd;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:670:62),_void>
  failPromise;
  Fault f_7;
  undefined1 local_328 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:669:58),_void>
  promise;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_318;
  socklen_t saddrLen;
  FdObserver observer;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:659:3)>
  _kjDefer659;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:629:3)>
  _kjDefer632;
  int failpipe [2];
  sockaddr_in saddr;
  Own<kj::Function<void_()>::Iface,_std::nullptr_t> local_240;
  WaitScope waitScope;
  Thread thread;
  FdObserver failObserver;
  EventLoop loop;
  UnixEventPort port;
  
  UnixEventPort::UnixEventPort(&port);
  EventLoop::EventLoop(&loop,&port.super_EventPort);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  do {
    serverFd.fd = socket(2,1,0);
    if (-1 < serverFd.fd) goto LAB_001cc8a3;
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&observer,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x268,iVar3,"_kj_fd = socket(2, SOCK_STREAM, 0)","");
    kj::_::Debug::Fault::fatal((Fault *)&observer);
  }
LAB_001cc8a3:
  saddr.sin_zero[0] = '\0';
  saddr.sin_zero[1] = '\0';
  saddr.sin_zero[2] = '\0';
  saddr.sin_zero[3] = '\0';
  saddr.sin_zero[4] = '\0';
  saddr.sin_zero[5] = '\0';
  saddr.sin_zero[6] = '\0';
  saddr.sin_zero[7] = '\0';
  saddr.sin_family = 2;
  saddr.sin_port = 0;
  saddr.sin_addr.s_addr = 0x100007f;
  do {
    iVar3 = bind(serverFd.fd,(sockaddr *)&saddr,0x10);
    if (-1 < iVar3) goto LAB_001cc8eb;
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&observer,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x26d,iVar3,"bind(serverFd, reinterpret_cast<sockaddr*>(&saddr), sizeof(saddr))","")
    ;
    kj::_::Debug::Fault::fatal((Fault *)&observer);
  }
LAB_001cc8eb:
  saddrLen = 0x10;
  do {
    iVar3 = getsockname(serverFd.fd,(sockaddr *)&saddr,&saddrLen);
    if (-1 < iVar3) goto LAB_001cc925;
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&observer,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x26f,iVar3,"getsockname(serverFd, reinterpret_cast<sockaddr*>(&saddr), &saddrLen)",
               "");
    kj::_::Debug::Fault::fatal((Fault *)&observer);
  }
LAB_001cc925:
  do {
    iVar3 = listen(serverFd.fd,1);
    if (-1 < iVar3) goto LAB_001cc949;
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&observer,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x270,iVar3,"listen(serverFd, 1)","");
    kj::_::Debug::Fault::fatal((Fault *)&observer);
  }
LAB_001cc949:
  failpipe[0] = 0;
  failpipe[1] = 0;
  do {
    iVar3 = ::pipe(failpipe);
    if (-1 < iVar3) goto LAB_001cc975;
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&observer,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x274,iVar3,"pipe(failpipe)","");
    kj::_::Debug::Fault::fatal((Fault *)&observer);
  }
LAB_001cc975:
  _kjDefer632.maybeFunc.ptr.isSet = true;
  _kjDefer632.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:629:3)>_2
        )failpipe;
  local_240.ptr = (Iface *)operator_new(0x18);
  (local_240.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00580b30;
  *(OwnFd **)(local_240.ptr + 1) = &serverFd;
  *(int **)(local_240.ptr + 2) = failpipe;
  local_240.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::TestCase604::run()::$_6>>
        ::instance;
  Thread::Thread(&thread,(Function<void_()> *)&local_240);
  Own<kj::Function<void_()>::Iface,_std::nullptr_t>::dispose(&local_240);
  _kjDefer659.maybeFunc.ptr.isSet = true;
  _kjDefer659.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:659:3)>_2
        )&serverFd;
  do {
    clientFd.fd = socket(2,1,0);
    if (-1 < clientFd.fd) goto LAB_001cca10;
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&observer,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x295,iVar3,"_kj_fd = socket(2, SOCK_STREAM, 0)","");
    kj::_::Debug::Fault::fatal((Fault *)&observer);
  }
LAB_001cca10:
  do {
    iVar3 = ::connect(clientFd.fd,(sockaddr *)&saddr,saddrLen);
    if (-1 < iVar3) goto LAB_001cca45;
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&observer,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x296,iVar3,"connect(clientFd, reinterpret_cast<sockaddr*>(&saddr), saddrLen)","");
    kj::_::Debug::Fault::fatal((Fault *)&observer);
  }
LAB_001cca45:
  UnixEventPort::FdObserver::FdObserver(&observer,&port,clientFd.fd,5);
  UnixEventPort::FdObserver::FdObserver(&failObserver,&port,failpipe[0],5);
  UnixEventPort::FdObserver::whenUrgentDataAvailable((FdObserver *)&failPromise);
  lVar1 = *(long *)((long)failPromise.super_PromiseBase.node.ptr + 8);
  if (lVar1 == 0 || (ulong)((long)failPromise.super_PromiseBase.node.ptr - lVar1) < 0x28) {
    pvVar5 = operator_new(0x400);
    PVar7.node.ptr = (OwnPromiseNode)((long)pvVar5 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar7.node.ptr,(OwnPromiseNode *)&failPromise,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:669:58)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar5 + 0x3d8) = &PTR_destroy_00580b98;
    *(void **)((long)pvVar5 + 0x3e0) = pvVar5;
  }
  else {
    *(undefined8 *)((long)failPromise.super_PromiseBase.node.ptr + 8) = 0;
    PVar7.node.ptr = (OwnPromiseNode)((long)failPromise.super_PromiseBase.node.ptr + -0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar7.node.ptr,(OwnPromiseNode *)&failPromise,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:669:58)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)failPromise.super_PromiseBase.node.ptr + -0x28) = &PTR_destroy_00580b98;
    *(long *)((long)failPromise.super_PromiseBase.node.ptr + -0x20) = lVar1;
  }
  f_7.exception = (Exception *)0x0;
  local_318.ptr = (PromiseNode *)0x0;
  promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar7.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_318);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f_7);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&failPromise);
  UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_328);
  NVar2 = (NullableValue<kj::OwnFd>)
          ((SleepHooks *)&((PromiseArenaMember *)local_328)->arena)->_vptr_SleepHooks;
  if (NVar2 == (NullableValue<kj::OwnFd>)0x0 || (ulong)((long)local_328 - (long)NVar2) < 0x28) {
    pvVar5 = operator_new(0x400);
    PVar7.node.ptr = (OwnPromiseNode)((long)pvVar5 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar7.node.ptr,(OwnPromiseNode *)local_328,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:670:62)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar5 + 0x3d8) = &PTR_destroy_00580bf0;
    *(void **)((long)pvVar5 + 0x3e0) = pvVar5;
  }
  else {
    ((SleepHooks *)&((PromiseArenaMember *)local_328)->arena)->_vptr_SleepHooks = (_func_int **)0x0;
    PVar7.node.ptr = (OwnPromiseNode)((unsigned_long *)((long)local_328 + -0x30) + 1);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar7.node.ptr,(OwnPromiseNode *)local_328,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:670:62)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((Disposer *)((unsigned_long *)((long)local_328 + -0x30) + 1))->_vptr_Disposer =
         (_func_int **)&PTR_destroy_00580bf0;
    ((Maybe<kj::OwnFd> *)((long)local_328 + -0x20))->ptr = NVar2;
  }
  f_7.exception = (Exception *)0x0;
  local_318.ptr = (PromiseNode *)0x0;
  failPromise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar7.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_318);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f_7);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_328);
  location.function = "run";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
  ;
  location.lineNumber = 0x2a0;
  location.columnNumber = 0x17;
  Promise<bool>::exclusiveJoin((Promise<bool> *)&f_7,&promise,location);
  _Var4 = Promise<bool>::wait((Promise<bool> *)&f_7,&waitScope);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f_7);
  if ((char)_Var4 == '\0') {
    if (kj::_::Debug::minSeverity < 2) {
      kj::_::Debug::log<char_const(&)[55]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x2b2,WARNING,"\"MSG_OOB doesn\'t seem to be supported on your platform.\"",
                 (char (*) [55])"MSG_OOB doesn\'t seem to be supported on your platform.");
    }
  }
  else {
    do {
      sVar6 = recv(clientFd.fd,&c,1,1);
      if (-1 < sVar6) goto LAB_001ccd02;
      iVar3 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar3 == -1);
    if (iVar3 != 0) {
      kj::_::Debug::Fault::Fault
                (&f_7,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x2ac,iVar3,"recv(clientFd, &c, 1, MSG_OOB)","");
      kj::_::Debug::Fault::fatal(&f_7);
    }
LAB_001ccd02:
    f_7.exception._0_1_ = 0x6f;
    if ((c != 'o') && (kj::_::Debug::minSeverity < 3)) {
      local_318.ptr._0_1_ = 0x6f;
      kj::_::Debug::log<char_const(&)[30],kj::_::DebugComparison<char,char&>&,char,char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x2ad,ERROR,"\"failed: expected \" \"(\'o\') == (c)\", _kjCondition, \'o\', c",
                 (char (*) [30])"failed: expected (\'o\') == (c)",
                 (DebugComparison<char,_char_&> *)&f_7,(char *)&local_318,&c);
    }
    do {
      sVar6 = recv(clientFd.fd,&c,1,0);
      if (-1 < sVar6) goto LAB_001ccda3;
      iVar3 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar3 == -1);
    if (iVar3 != 0) {
      kj::_::Debug::Fault::Fault
                (&f_7,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x2ae,iVar3,"recv(clientFd, &c, 1, 0)","");
      kj::_::Debug::Fault::fatal(&f_7);
    }
LAB_001ccda3:
    f_7.exception._0_1_ = 0x69;
    if ((c != 'i') && (kj::_::Debug::minSeverity < 3)) {
      local_318.ptr._0_1_ = 0x69;
      kj::_::Debug::log<char_const(&)[30],kj::_::DebugComparison<char,char&>&,char,char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x2af,ERROR,"\"failed: expected \" \"(\'i\') == (c)\", _kjCondition, \'i\', c",
                 (char (*) [30])"failed: expected (\'i\') == (c)",
                 (DebugComparison<char,_char_&> *)&f_7,(char *)&local_318,&c);
    }
  }
  c = 'q';
  do {
    sVar6 = ::send(clientFd.fd,&c,1,0);
    if (-1 < sVar6) goto LAB_001cce69;
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    kj::_::Debug::Fault::Fault
              (&f_7,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x2b7,iVar3,"send(clientFd, &c, 1, 0)","");
    kj::_::Debug::Fault::fatal(&f_7);
  }
LAB_001cce69:
  do {
    iVar3 = shutdown(clientFd.fd,2);
    if (-1 < iVar3) goto LAB_001cce8d;
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    kj::_::Debug::Fault::Fault
              (&f_7,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x2b8,iVar3,"shutdown(clientFd, SHUT_RDWR)","");
    kj::_::Debug::Fault::fatal(&f_7);
  }
LAB_001cce8d:
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&failPromise);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
  UnixEventPort::FdObserver::~FdObserver(&failObserver);
  UnixEventPort::FdObserver::~FdObserver(&observer);
  OwnFd::~OwnFd(&clientFd);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:659:3)>
  ::~Deferred(&_kjDefer659);
  Thread::~Thread(&thread);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:629:3)>
  ::~Deferred(&_kjDefer632);
  OwnFd::~OwnFd(&serverFd);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  UnixEventPort::~UnixEventPort(&port);
  return;
}

Assistant:

TEST(AsyncUnixTest, UrgentObserver) {
  // Verify that FdObserver correctly detects availability of out-of-band data.
  // Availability of out-of-band data is implementation-specific.
  // Linux's and OS X's TCP/IP stack supports out-of-band messages for TCP sockets, which is used
  // for this test.

  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);
  char c;

  // Spawn a TCP server
  auto serverFd = KJ_SYSCALL_FD(socket(AF_INET, SOCK_STREAM, 0));
  sockaddr_in saddr;
  memset(&saddr, 0, sizeof(saddr));
  saddr.sin_family = AF_INET;
  saddr.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
  KJ_SYSCALL(bind(serverFd, reinterpret_cast<sockaddr*>(&saddr), sizeof(saddr)));
  socklen_t saddrLen = sizeof(saddr);
  KJ_SYSCALL(getsockname(serverFd, reinterpret_cast<sockaddr*>(&saddr), &saddrLen));
  KJ_SYSCALL(listen(serverFd, 1));

  // Create a pipe that we'll use to signal if MSG_OOB return EINVAL.
  int failpipe[2]{};
  KJ_SYSCALL(pipe(failpipe));
  KJ_DEFER({
    close(failpipe[0]);
    close(failpipe[1]);
  });

  // Accept one connection, send in-band and OOB byte, wait for a quit message
  Thread thread([&]() {
    char c;

    sockaddr_in caddr;
    socklen_t caddrLen = sizeof(caddr);
    auto clientFd = KJ_SYSCALL_FD(accept(serverFd, reinterpret_cast<sockaddr*>(&caddr), &caddrLen));
    delay();

    // Workaround: OS X won't signal POLLPRI without POLLIN. Also enqueue some in-band data.
    c = 'i';
    KJ_SYSCALL(send(clientFd, &c, 1, 0));
    c = 'o';
    KJ_SYSCALL_HANDLE_ERRORS(send(clientFd, &c, 1, MSG_OOB)) {
      case EINVAL:
        // Looks like MSG_OOB is not supported. (This is the case e.g. on WSL.)
        KJ_SYSCALL(write(failpipe[1], &c, 1));
        break;
      default:
        KJ_FAIL_SYSCALL("send(..., MSG_OOB)", error);
    }

    KJ_SYSCALL(recv(clientFd, &c, 1, 0));
    EXPECT_EQ('q', c);
  });
  KJ_DEFER({ shutdown(serverFd, SHUT_RDWR); serverFd = nullptr; });

  auto clientFd = KJ_SYSCALL_FD(socket(AF_INET, SOCK_STREAM, 0));
  KJ_SYSCALL(connect(clientFd, reinterpret_cast<sockaddr*>(&saddr), saddrLen));

  UnixEventPort::FdObserver observer(port, clientFd,
      UnixEventPort::FdObserver::OBSERVE_READ | UnixEventPort::FdObserver::OBSERVE_URGENT);
  UnixEventPort::FdObserver failObserver(port, failpipe[0],
      UnixEventPort::FdObserver::OBSERVE_READ | UnixEventPort::FdObserver::OBSERVE_URGENT);

  auto promise = observer.whenUrgentDataAvailable().then([]() { return true; });
  auto failPromise = failObserver.whenBecomesReadable().then([]() { return false; });

  bool oobSupported = promise.exclusiveJoin(kj::mv(failPromise)).wait(waitScope);
  if (oobSupported) {
#if __CYGWIN__
    // On Cygwin, reading the urgent byte first causes the subsequent regular read to block until
    // such a time as the connection closes -- and then the byte is successfully returned. This
    // seems to be a cygwin bug.
    KJ_SYSCALL(recv(clientFd, &c, 1, 0));
    EXPECT_EQ('i', c);
    KJ_SYSCALL(recv(clientFd, &c, 1, MSG_OOB));
    EXPECT_EQ('o', c);
#else
    // Attempt to read the urgent byte prior to reading the in-band byte.
    KJ_SYSCALL(recv(clientFd, &c, 1, MSG_OOB));
    EXPECT_EQ('o', c);
    KJ_SYSCALL(recv(clientFd, &c, 1, 0));
    EXPECT_EQ('i', c);
#endif
  } else {
    KJ_LOG(WARNING, "MSG_OOB doesn't seem to be supported on your platform.");
  }

  // Allow server thread to let its clientFd go out of scope.
  c = 'q';
  KJ_SYSCALL(send(clientFd, &c, 1, 0));
  KJ_SYSCALL(shutdown(clientFd, SHUT_RDWR));
}